

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall
TimeConversions_Correctness_Test::~TimeConversions_Correctness_Test
          (TimeConversions_Correctness_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimeConversions, Correctness)
{
    using namespace units;
    double one_min_in_sec = 60.0;
    double one_hour_in_min = 60.0;
    double one_day_in_hour = 24.0;
    double one_week_in_day = 7.0;
    double one_day_in_sec = 86400.0;

    EXPECT_NEAR(convert(minute, s), one_min_in_sec, test::tolerance);
    EXPECT_NEAR(convert(hr, minute), one_hour_in_min, test::tolerance);
    EXPECT_NEAR(
        convert(unit_cast(precise::time::day), hr),
        one_day_in_hour,
        test::tolerance);
    EXPECT_NEAR(
        convert(unit_cast(precise::time::week), unit_cast(precise::time::day)),
        one_week_in_day,
        test::tolerance);
    EXPECT_NEAR(
        convert(unit_cast(precise::time::day), s),
        one_day_in_sec,
        test::tolerance);
    EXPECT_NEAR(
        convert(unit_cast(precise::time::yr), unit_cast(precise::time::day)),
        365.0,
        test::tolerance);
}